

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O2

string * __thiscall Cmd::readlineNoTTY_abi_cxx11_(string *__return_storage_ptr__,Cmd *this)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar3 = false;
  do {
    iVar2 = fgetc((FILE *)this->in_);
    bVar1 = true;
    if ((iVar2 != -1) && (iVar2 != 10)) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      bVar1 = bVar3;
    }
  } while ((iVar2 != 10) && (bVar3 = bVar1, iVar2 != -1));
  if (!bVar1) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string readlineNoTTY() const {
		std::string line;

		while (true) {
			const int ch = fgetc(in_);
			if (ch == EOF || ch == '\n') {
				return line;
			} else {
				line.push_back(ch);
			}
		}
	}